

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O1

int str_utf8_is_whitespace(int code)

{
  int iVar1;
  
  if ((((((code < 0x21) || (code == 0xa0)) || (code == 0x34f)) || (0xffffffef < code - 0x2010U)) ||
      ((((code - 0x205fU < 0x11 && ((0x1f83fU >> (code - 0x205fU & 0x1f) & 1) != 0)) ||
        ((code - 0x2028U < 8 || ((code == 0x3000 || (0xffffffef < code - 0xfe10U)))))) ||
       (code - 0xfff9U < 4)))) || (iVar1 = 0, code == 0xfeff)) {
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int str_utf8_is_whitespace(int code)
{
	// check if unicode is not empty
	if(code > 0x20 && code != 0xA0 && code != 0x034F && (code < 0x2000 || code > 0x200F) && (code < 0x2028 || code > 0x202F) &&
		(code < 0x205F || code > 0x2064) && (code < 0x206A || code > 0x206F) && code != 0x3000  && (code < 0xFE00 || code > 0xFE0F) &&
		code != 0xFEFF && (code < 0xFFF9 || code > 0xFFFC))
	{
		return 0;
	}
	return 1;
}